

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

void client_map(natwm_state *state,client *client,monitor *monitor)

{
  uint16_t uVar1;
  xcb_rectangle_t rect;
  xcb_window_t window;
  xcb_connection_t *connection;
  
  if (client != (client *)0x0) {
    uVar1 = client_get_active_border_width(state->workspace_list->theme,client);
    if (client->is_fullscreen == true) {
      connection = state->xcb;
      window = client->window;
      rect = monitor->rect;
    }
    else {
      connection = state->xcb;
      window = client->window;
      rect = (xcb_rectangle_t)
             ((ulong)(ushort)((monitor->rect).x + (client->rect).x) |
             (ulong)(ushort)((monitor->rect).y + (client->rect).y) << 0x10 |
             (ulong)(client->rect).width << 0x20 | (ulong)(client->rect).height << 0x30);
    }
    client_configure_window_rect(connection,window,rect,(uint)uVar1);
    if ((client->state & CLIENT_HIDDEN) != 0) {
      client->state = client->state & 0xfb;
    }
    xcb_map_window(state->xcb,client->window);
    return;
  }
  return;
}

Assistant:

void client_map(const struct natwm_state *state, struct client *client,
                const struct monitor *monitor)
{
        if (client == NULL) {
                // Skip this client
                return;
        }

        struct theme *theme = state->workspace_list->theme;
        uint32_t border_width = client_get_active_border_width(theme, client);

        if (client->is_fullscreen) {
                client_configure_window_rect(
                        state->xcb, client->window, monitor->rect, border_width);
        } else {
                xcb_rectangle_t new_rect = {
                        (int16_t)(client->rect.x + monitor->rect.x),
                        (int16_t)(client->rect.y + monitor->rect.y),
                        client->rect.width,
                        client->rect.height,
                };

                client_configure_window_rect(state->xcb, client->window, new_rect, border_width);
        }

        if (client->state & CLIENT_HIDDEN) {
                client->state &= (uint8_t)~CLIENT_HIDDEN;
        }

        xcb_map_window(state->xcb, client->window);
}